

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopn_file.c
# Opt level: O1

WOPNFile * WOPN_Init(uint16_t melodic_banks,uint16_t percussive_banks)

{
  ushort uVar1;
  WOPNFile *pWVar2;
  WOPNBank *pWVar3;
  long lVar4;
  
  pWVar2 = (WOPNFile *)calloc(1,0x20);
  if (pWVar2 == (WOPNFile *)0x0) {
    pWVar2 = (WOPNFile *)0x0;
  }
  else {
    uVar1 = 1;
    if (1 < melodic_banks) {
      uVar1 = melodic_banks;
    }
    pWVar2->banks_count_melodic = uVar1;
    pWVar3 = (WOPNBank *)calloc((ulong)uVar1,0x2424);
    pWVar2->banks_melodic = pWVar3;
    if (melodic_banks == 0) {
      lVar4 = 0x48;
      do {
        pWVar3->bank_name[lVar4] = '\x02';
        lVar4 = lVar4 + 0x48;
      } while (lVar4 != 0x2448);
    }
    uVar1 = 1;
    if (1 < percussive_banks) {
      uVar1 = percussive_banks;
    }
    pWVar2->banks_count_percussion = uVar1;
    pWVar3 = (WOPNBank *)calloc((ulong)uVar1,0x2424);
    pWVar2->banks_percussive = pWVar3;
    if (percussive_banks == 0) {
      lVar4 = 0x48;
      do {
        pWVar3->bank_name[lVar4] = '\x02';
        lVar4 = lVar4 + 0x48;
      } while (lVar4 != 0x2448);
    }
  }
  return pWVar2;
}

Assistant:

WOPNFile *WOPN_Init(uint16_t melodic_banks, uint16_t percussive_banks)
{
    WOPNFile *file = (WOPNFile*)calloc(1, sizeof(WOPNFile));
    if(!file)
        return NULL;

    file->banks_count_melodic = (melodic_banks != 0) ? melodic_banks : 1;
    file->banks_melodic = (WOPNBank*)calloc(file->banks_count_melodic, sizeof(WOPNBank));

    if(melodic_banks == 0)
    {
        unsigned i;
        for(i = 0; i < 128; ++i)
            file->banks_melodic[0].ins[i].inst_flags = WOPN_Ins_IsBlank;
    }

    file->banks_count_percussion = (percussive_banks != 0) ? percussive_banks : 1;
    file->banks_percussive = (WOPNBank*)calloc(file->banks_count_percussion, sizeof(WOPNBank));

    if(percussive_banks == 0)
    {
        unsigned i;
        for(i = 0; i < 128; ++i)
            file->banks_percussive[0].ins[i].inst_flags = WOPN_Ins_IsBlank;
    }

    return file;
}